

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O1

size_t __thiscall io_buf::bin_write_fixed(io_buf *this,char *data,size_t len)

{
  uint uVar1;
  char *in_RAX;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  char *p;
  char *local_28;
  
  if (len != 0) {
    local_28 = in_RAX;
    buf_write(this,&local_28,len);
    memcpy(local_28,data,len);
    if (this->_verify_hash == true) {
      uVar6 = this->_hash;
      uVar1 = (uint)len;
      uVar3 = uVar1;
      if ((int)uVar1 < 0) {
        uVar3 = uVar1 + 3;
      }
      pbVar2 = (byte *)(local_28 + (int)(uVar3 & 0xfffffffc));
      if (6 < uVar1 + 3) {
        lVar5 = (long)-((int)uVar3 >> 2);
        do {
          uVar6 = ((uint)(*(int *)(pbVar2 + lVar5 * 4) * -0x3361d2af) >> 0x11 |
                  *(int *)(pbVar2 + lVar5 * 4) * 0x16a88000) * 0x1b873593 ^ uVar6;
          uVar6 = (uVar6 << 0xd | uVar6 >> 0x13) * 5 + 0xe6546b64;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0);
      }
      uVar4 = 0;
      uVar3 = 0;
      switch(uVar1 & 3) {
      case 3:
        uVar3 = (uint)pbVar2[2] << 0x10;
      case 2:
        uVar4 = uVar3 | (uint)pbVar2[1] << 8;
      case 1:
        uVar6 = uVar6 ^ ((*pbVar2 ^ uVar4) * -0x3361d2af >> 0x11 | (*pbVar2 ^ uVar4) * 0x16a88000) *
                        0x1b873593;
      case 0:
        uVar6 = ((uVar6 ^ uVar1) >> 0x10 ^ uVar6 ^ uVar1) * -0x7a143595;
        uVar6 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51cb;
        this->_hash = uVar6 >> 0x10 ^ uVar6;
      }
    }
  }
  return len;
}

Assistant:

size_t bin_write_fixed(const char* data, size_t len)
  {
    if (len > 0)
    {
      char* p;
      buf_write(p, len);

      memcpy(p, data, len);

      // compute hash for check-sum
      if (_verify_hash)
        _hash = (uint32_t)uniform_hash(p, len, _hash);
    }
    return len;
  }